

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

void __thiscall loguru::LogScopeRAII::~LogScopeRAII(LogScopeRAII *this)

{
  int iVar1;
  Callback *p;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  Text buff;
  char *local_10;
  
  if (this->_file == (char *)0x0) {
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)s_mutex);
  lVar3 = DAT_0016ad40;
  if (iVar1 == 0) {
    if ((this->_indent_stderr == true) && (s_stderr_indentation != 0)) {
      LOCK();
      s_stderr_indentation = s_stderr_indentation + -1;
      UNLOCK();
    }
    if (s_callbacks != DAT_0016ad40) {
      iVar1 = this->_verbosity;
      lVar2 = s_callbacks;
      do {
        if ((iVar1 <= *(int *)(lVar2 + 0x30)) && (*(int *)(lVar2 + 0x48) != 0)) {
          *(int *)(lVar2 + 0x48) = *(int *)(lVar2 + 0x48) + -1;
        }
        lVar2 = lVar2 + 0x50;
      } while (lVar2 != lVar3);
    }
    lVar3 = std::chrono::_V2::system_clock::now();
    textprintf((char *)&local_10,(double)(lVar3 - this->_start_time_ns) / 1000000000.0,"%.*f s: %s",
               3,this->_name);
    log_to_everywhere(1,this->_verbosity,this->_file,this->_line,"} ",local_10);
    free(local_10);
    pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
    return;
  }
  uVar4 = std::__throw_system_error(iVar1);
  __clang_call_terminate(uVar4);
}

Assistant:

LogScopeRAII::~LogScopeRAII()
	{
		if (_file) {
			std::lock_guard<std::recursive_mutex> lock(s_mutex);
			if (_indent_stderr && s_stderr_indentation > 0) {
				--s_stderr_indentation;
			}
			for (auto& p : s_callbacks) {
				// Note: Callback indentation cannot change!
				if (_verbosity <= p.verbosity) {
					// in unlikely case this callback is new
					if (p.indentation > 0) {
						--p.indentation;
					}
				}
			}
#if LOGURU_VERBOSE_SCOPE_ENDINGS
			auto duration_sec = (now_ns() - _start_time_ns) / 1e9;
			auto buff = textprintf("%.*f s: %s", LOGURU_SCOPE_TIME_PRECISION, duration_sec, _name);
			log_to_everywhere(1, _verbosity, _file, _line, "} ", buff.c_str());
#else
			log_to_everywhere(1, _verbosity, _file, _line, "}", "");
#endif
		}
	}